

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expressions.hpp
# Opt level: O0

nameType nameDeclaration(string *name)

{
  bool bVar1;
  byte local_1b5;
  bool local_1b2;
  _Self local_188;
  _Self local_180;
  _Self local_178;
  _Self local_170;
  undefined4 local_168;
  allocator<char> local_161;
  string local_160;
  string local_140;
  undefined1 local_120 [8];
  VariableObject obj;
  string local_48;
  _Self local_28;
  _Self local_20;
  string *local_18;
  string *name_local;
  
  local_18 = name;
  local_20._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find(&BuiltInFunctions_abi_cxx11_,name);
  local_28._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&BuiltInFunctions_abi_cxx11_);
  bVar1 = std::operator==(&local_20,&local_28);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::__cxx11::string::string((string *)&local_48,name);
    bVar1 = ScopeManager::find(&scopeManager,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_140,name);
      ScopeManager::get((VariableObject *)local_120,&scopeManager,&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"Function",&local_161)
      ;
      bVar1 = VariableObject::containType((VariableObject *)local_120,&local_160);
      local_1b2 = true;
      if (!bVar1) {
        local_1b2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&obj.item.value,"Function");
      }
      std::__cxx11::string::~string((string *)&local_160);
      std::allocator<char>::~allocator(&local_161);
      name_local._4_4_ = (nameType)(local_1b2 != false);
      local_168 = 1;
      VariableObject::~VariableObject((VariableObject *)local_120);
    }
    else {
      local_170._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassObject,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassObject>_>_>
           ::find(&Classes_abi_cxx11_,name);
      local_178._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassObject,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassObject>_>_>
           ::end(&Classes_abi_cxx11_);
      bVar1 = std::operator==(&local_170,&local_178);
      local_1b5 = 1;
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        local_180._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(&BuiltInClasses_abi_cxx11_,name);
        local_188._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&BuiltInClasses_abi_cxx11_);
        bVar1 = std::operator==(&local_180,&local_188);
        local_1b5 = bVar1 ^ 0xff;
      }
      if ((local_1b5 & 1) == 0) {
        name_local._4_4_ = Undeclared;
      }
      else {
        name_local._4_4_ = DeclaredClass;
      }
    }
  }
  else {
    name_local._4_4_ = DeclaredFunction;
  }
  return name_local._4_4_;
}

Assistant:

nameType nameDeclaration(string name) {
	if (BuiltInFunctions.find(name) != BuiltInFunctions.end()) {
		return DeclaredFunction;
	}
	if (scopeManager.find(name)) {
		VariableObject obj = scopeManager.get(name);
		if (obj.containType("Function") or obj.item.type == "Function") {
			return DeclaredFunction;
		}
		return DeclaredVariable;
	}
	if (Classes.find(name) != Classes.end() or BuiltInClasses.find(name) != BuiltInClasses.end()) {
		return DeclaredClass;
	}
	return Undeclared;
}